

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxhash.c
# Opt level: O1

LispPTR STRING_EQUAL_HASHBITS(LispPTR object)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  DLword **ppDVar4;
  ulong uVar5;
  uint uVar6;
  DLword *pDVar7;
  DLword *pDVar8;
  
  uVar3 = (ulong)object;
  uVar1 = *(ushort *)((ulong)((object >> 9) * 2) + (long)MDStypetbl ^ 2) & 0x7ff;
  if (uVar1 < 0x10) {
    if (uVar1 != 4) {
      if (uVar1 == 0xe) goto LAB_00132987;
LAB_001329b3:
      uVar6 = object >> 9 & 0x7f ^ object << 3 ^ object >> 0x10;
      goto LAB_00132ae1;
    }
LAB_0013294e:
    uVar2 = object & 0xfffffff;
    if ((object & 0xfff0000) == 0) {
      ppDVar4 = &AtomSpace;
      uVar3 = (ulong)(uVar2 * 5) << 2;
    }
    else {
      if ((object & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
      }
      ppDVar4 = &Lisp_world;
      uVar3 = (ulong)(uVar2 * 2);
    }
    pDVar8 = (DLword *)
             ((ulong)((*(uint *)(uVar3 + (long)*ppDVar4) & 0xfffffff) * 2) + (long)Lisp_world);
    if ((object & 0xfff0000) == 0) {
      pDVar7 = AtomSpace + (ulong)(uVar2 * 5) * 2;
    }
    else {
      if ((object & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
      }
      pDVar7 = (DLword *)((ulong)(uVar2 * 2) + (long)Lisp_world);
    }
    uVar6 = (uint)((ulong)*(undefined8 *)(pDVar7 + 6) >> 0x2d) & 1;
    uVar2 = (uint)*(byte *)((ulong)pDVar8 ^ 3);
    uVar5 = 1;
  }
  else {
    if (uVar1 != 0x10) {
      if (uVar1 != 0x15) goto LAB_001329b3;
      goto LAB_0013294e;
    }
LAB_00132987:
    if ((object & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar3);
    }
    if ((Lisp_world[uVar3 + 3] >> 0xc & 1) == 0) goto LAB_001329b3;
    uVar6 = (uint)((char)Lisp_world[uVar3 + 3] == 'D');
    pDVar8 = Lisp_world + (*(uint *)(Lisp_world + uVar3) & 0xfffffff);
    uVar5 = (ulong)Lisp_world[uVar3 + 2];
    uVar2 = *(uint *)(Lisp_world + uVar3 + 4);
  }
  if (uVar6 == 0) {
    if (uVar2 != 0) {
      uVar5 = uVar5 + (long)pDVar8;
      uVar6 = 0;
      do {
        uVar6 = (uVar6 + (uVar6 & 0xfff) * 4) * 0x101 + (*(byte *)(uVar5 ^ 3) | 0x20);
        uVar5 = uVar5 + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
      goto LAB_00132ae1;
    }
  }
  else if (uVar2 != 0) {
    pDVar8 = pDVar8 + uVar5;
    uVar6 = 0;
    do {
      uVar6 = (uVar6 + (uVar6 & 0xfff) * 4) * 0x101 + (*(ushort *)((ulong)pDVar8 ^ 2) | 0x20);
      pDVar8 = pDVar8 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    goto LAB_00132ae1;
  }
  uVar6 = 0;
LAB_00132ae1:
  return uVar6 & 0xffff | 0xe0000;
}

Assistant:

LispPTR STRING_EQUAL_HASHBITS(LispPTR object) {
  return (S_POSITIVE | (0xFFFF & (stringequalhash(object))));
}